

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Orphan<capnp::DynamicValue> * __thiscall
capnp::DynamicStruct::Builder::disown
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,Builder *this,Field field)

{
  ushort uVar1;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  Field field_07;
  Field field_08;
  long *plVar2;
  void *pvVar3;
  StructDataBitCount SVar4;
  StructSchema SVar5;
  bool bVar6;
  Schema SVar7;
  ulong unaff_RBP;
  ulong uVar8;
  undefined8 uVar9;
  uint uVar10;
  Type TVar11;
  StructBuilder inner;
  Field field_1;
  BuilderFor<capnp::DynamicStruct> src;
  Orphan<capnp::DynamicStruct> result;
  Builder dst;
  undefined1 local_358 [24];
  OrphanBuilder OStack_340;
  undefined4 uStack_320;
  undefined2 uStack_31c;
  undefined2 uStack_31a;
  undefined4 local_318;
  undefined4 uStack_314;
  Orphan<capnp::DynamicValue> local_308;
  undefined7 uStack_2d0;
  undefined1 uStack_2c9;
  undefined7 uStack_2c8;
  undefined1 local_2b8 [24];
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  Schema local_278;
  anon_union_56_12_1c583c3a_for_Builder_1 aStack_270;
  BuilderFor<DynamicStruct> local_238;
  Builder local_208;
  BuilderArena *local_1c8;
  CapTableBuilder *pCStack_1c0;
  WirePointer *local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  StructSchema local_188;
  char *pcStack_180;
  SegmentReader *local_178;
  CapTableReader *pCStack_170;
  byte *local_168;
  WirePointer *pWStack_160;
  long local_158;
  StructSchema local_148;
  char *pcStack_140;
  SegmentReader *local_138;
  CapTableReader *pCStack_130;
  byte *local_128;
  WirePointer *pWStack_120;
  long local_118;
  Schema local_108;
  char *pcStack_100;
  SegmentReader *local_f8;
  CapTableReader *pCStack_f0;
  byte *local_e8;
  WirePointer *pWStack_e0;
  long local_d8;
  undefined8 uStack_d0;
  Orphan<capnp::DynamicStruct> local_c0;
  Builder local_98;
  Reader local_68;
  
  pvVar3 = field.proto._reader.data;
  SVar4 = field.proto._reader.dataSize;
  uVar9 = ZEXT48(field.proto._reader.dataSize);
  if (0x4f < field.proto._reader.dataSize) {
    if (*(short *)((long)field.proto._reader.data + 8) == 1) {
      get((Builder *)local_358,this,field);
      DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_238,(Builder *)local_358);
      uVar9 = local_358._16_8_;
      if ((local_358._0_4_ == CAPABILITY) &&
         ((SegmentBuilder *)local_358._16_8_ != (SegmentBuilder *)0x0)) {
        local_358._16_8_ = (char *)0x0;
        (*(code *)**(undefined8 **)local_358._8_8_)
                  (local_358._8_8_,(char *)(uVar9 + *(long *)(*(long *)uVar9 + -0x10)));
      }
      OStack_340.segment = *(SegmentBuilder **)&(this->builder).dataSize;
      local_358._0_8_ = (this->builder).segment;
      local_358._8_8_ = (this->builder).capTable;
      local_358._16_8_ = (this->builder).data;
      OStack_340.tag.content = (uint64_t)(this->builder).pointers;
      SVar7.raw = (RawBrandedSchema *)capnp::_::StructBuilder::getArena((StructBuilder *)local_358);
      local_358._8_8_ = capnp::_::StructBuilder::getCapTable((StructBuilder *)local_358);
      local_358._0_8_ = SVar7.raw;
      Orphanage::newOrphan(&local_c0,(Orphanage *)local_358,local_238.schema);
      Orphan<capnp::DynamicStruct>::get(&local_98,&local_c0);
      which((Maybe<capnp::StructSchema::Field> *)local_358,&local_238);
      if (local_358[0] == true) {
        uStack_d0 = CONCAT44(uStack_314,local_318);
        local_308.builder.location._7_1_ = (undefined1)_uStack_320;
        uStack_2d0 = (undefined7)((ulong)_uStack_320 >> 8);
        uStack_2c9 = (undefined1)local_318;
        uStack_2c8 = (undefined7)((ulong)uStack_d0 >> 8);
        local_308.builder.segment._7_1_ = SUB81(OStack_340.capTable,0);
        local_308.builder.capTable._0_7_ = (undefined7)((ulong)OStack_340.capTable >> 8);
        local_308.builder.capTable._7_1_ = SUB81(OStack_340.location,0);
        local_308.builder.location._0_7_ = (undefined7)((ulong)OStack_340.location >> 8);
        local_308.field_1._15_1_ = (undefined1)OStack_340.tag.content;
        local_308.builder.tag.content._0_7_ = (undefined7)(OStack_340.tag.content >> 8);
        local_308.builder.tag.content._7_1_ = SUB81(OStack_340.segment,0);
        local_308.builder.segment._0_7_ = (undefined7)((ulong)OStack_340.segment >> 8);
        local_308._7_1_ = SUB81(local_358._8_8_,0);
        local_308.field_1.intValue._0_4_ = SUB84(local_358._8_8_,1);
        local_308.field_1.intValue._4_3_ = SUB83(local_358._8_8_,5);
        local_308.field_1.intValue._7_1_ = (undefined1)local_358._16_8_;
        local_308.field_1._8_7_ = SUB87(local_358._16_8_,1);
        local_108.raw = (RawBrandedSchema *)local_358._8_8_;
        pcStack_100 = (char *)local_358._16_8_;
        local_f8 = (SegmentReader *)OStack_340.tag.content;
        pCStack_f0 = (CapTableReader *)OStack_340.segment;
        local_e8 = (byte *)OStack_340.capTable;
        pWStack_e0 = (WirePointer *)OStack_340.location;
        local_d8 = _uStack_320;
        local_118 = _uStack_320;
        local_128 = (byte *)OStack_340.capTable;
        pWStack_120 = (WirePointer *)OStack_340.location;
        local_138 = (SegmentReader *)OStack_340.tag.content;
        pCStack_130 = (CapTableReader *)OStack_340.segment;
        local_148.super_Schema.raw = (Schema)(Schema)local_358._8_8_;
        pcStack_140 = (char *)local_358._16_8_;
        field_02._8_8_ = local_358._16_8_;
        field_02.parent.super_Schema.raw = (Schema)(Schema)local_358._8_8_;
        field_02.proto._reader.segment = (SegmentReader *)OStack_340.tag.content;
        field_02.proto._reader.capTable = (CapTableReader *)OStack_340.segment;
        field_02.proto._reader.data = OStack_340.capTable;
        field_02.proto._reader.pointers = (WirePointer *)OStack_340.location;
        field_02.proto._reader.dataSize = uStack_320;
        field_02.proto._reader.pointerCount = uStack_31c;
        field_02.proto._reader._38_2_ = uStack_31a;
        field_02.proto._reader._40_8_ = uStack_d0;
        disown((Orphan<capnp::DynamicValue> *)local_358,&local_238,field_02);
        field_03._8_8_ = pcStack_100;
        field_03.parent.super_Schema.raw = (Schema)(Schema)local_108.raw;
        field_03.proto._reader.segment = local_f8;
        field_03.proto._reader.capTable = pCStack_f0;
        field_03.proto._reader.data = local_e8;
        field_03.proto._reader.pointers = pWStack_e0;
        field_03.proto._reader.dataSize = (undefined4)local_d8;
        field_03.proto._reader.pointerCount = local_d8._4_2_;
        field_03.proto._reader._38_2_ = local_d8._6_2_;
        field_03.proto._reader._40_8_ = uStack_d0;
        adopt(&local_98,field_03,(Orphan<capnp::DynamicValue> *)local_358);
        if (OStack_340.segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&OStack_340);
        }
      }
      StructSchema::getFieldByDiscriminant
                ((Maybe<capnp::StructSchema::Field> *)local_358,&local_238.schema,0);
      if (local_358[0] == true) {
        local_308.builder.location._7_1_ = (undefined1)_uStack_320;
        uStack_2d0 = (undefined7)((ulong)_uStack_320 >> 8);
        uStack_2c9 = (undefined1)local_318;
        uStack_2c8 = (undefined7)(CONCAT44(uStack_314,local_318) >> 8);
        local_308.builder.segment._7_1_ = SUB81(OStack_340.capTable,0);
        local_308.builder.capTable._0_7_ = (undefined7)((ulong)OStack_340.capTable >> 8);
        local_308.builder.capTable._7_1_ = SUB81(OStack_340.location,0);
        local_308.builder.location._0_7_ = (undefined7)((ulong)OStack_340.location >> 8);
        local_308.field_1._15_1_ = (undefined1)OStack_340.tag.content;
        local_308.builder.tag.content._0_7_ = (undefined7)(OStack_340.tag.content >> 8);
        local_308.builder.tag.content._7_1_ = SUB81(OStack_340.segment,0);
        local_308.builder.segment._0_7_ = (undefined7)((ulong)OStack_340.segment >> 8);
        local_308._7_1_ = SUB81(local_358._8_8_,0);
        local_308.field_1.intValue._0_4_ = SUB84(local_358._8_8_,1);
        local_308.field_1.intValue._4_3_ = SUB83(local_358._8_8_,5);
        local_308.field_1.intValue._7_1_ = (undefined1)local_358._16_8_;
        local_308.field_1._8_7_ = SUB87(local_358._16_8_,1);
        local_188.super_Schema.raw = (Schema)(Schema)local_358._8_8_;
        pcStack_180 = (char *)local_358._16_8_;
        local_178 = (SegmentReader *)OStack_340.tag.content;
        pCStack_170 = (CapTableReader *)OStack_340.segment;
        local_168 = (byte *)OStack_340.capTable;
        pWStack_160 = (WirePointer *)OStack_340.location;
        local_158 = _uStack_320;
        field_04._8_8_ = local_358._16_8_;
        field_04.parent.super_Schema.raw = (Schema)(Schema)local_358._8_8_;
        field_04.proto._reader.segment = (SegmentReader *)OStack_340.tag.content;
        field_04.proto._reader.capTable = (CapTableReader *)OStack_340.segment;
        field_04.proto._reader.data = OStack_340.capTable;
        field_04.proto._reader.pointers = (WirePointer *)OStack_340.location;
        field_04.proto._reader.dataSize = uStack_320;
        field_04.proto._reader.pointerCount = uStack_31c;
        field_04.proto._reader._38_2_ = uStack_31a;
        field_04.proto._reader._40_8_ = CONCAT44(uStack_314,local_318);
        clear(&local_238,field_04);
      }
      StructSchema::getNonUnionFields((FieldSubset *)local_358,&local_238.schema);
      if ((ulong)(uint)local_318 != 0) {
        uVar8 = 0;
        do {
          uVar9 = local_358._0_8_;
          uVar1 = *(ushort *)(_uStack_320 + uVar8 * 2);
          uVar10 = CONCAT22(0,uVar1);
          capnp::_::ListReader::getStructElement
                    ((StructReader *)(local_2b8 + 0x10),(ListReader *)(local_358 + 8),(uint)uVar1);
          SVar5.super_Schema.raw = local_238.schema.super_Schema.raw;
          local_2b8._0_8_ = uVar9;
          local_2b8._8_4_ = uVar10;
          local_308.builder.location._0_7_ = (undefined7)local_288;
          local_308.builder.location._7_1_ = (undefined1)((ulong)local_288 >> 0x38);
          uStack_2d0 = (undefined7)uStack_280;
          uStack_2c9 = (undefined1)((ulong)uStack_280 >> 0x38);
          local_308.builder.segment._0_7_ = (undefined7)local_298;
          local_308.builder.segment._7_1_ = (undefined1)((ulong)local_298 >> 0x38);
          local_308.builder.capTable._0_7_ = (undefined7)uStack_290;
          local_308.builder.capTable._7_1_ = (undefined1)((ulong)uStack_290 >> 0x38);
          local_308.field_1._8_7_ = (undefined7)local_2b8._16_8_;
          local_308.field_1._15_1_ = SUB81(local_2b8._16_8_,7);
          local_308.builder.tag.content._0_7_ = (undefined7)uStack_2a0;
          local_308.builder.tag.content._7_1_ = (undefined1)((ulong)uStack_2a0 >> 0x38);
          local_308._0_7_ = SUB87(uVar9,0);
          local_308._7_1_ = SUB81(uVar9,7);
          local_308.field_1.intValue._4_4_ = local_2b8._12_4_;
          local_308.field_1.intValue._0_4_ = uVar10;
          capnp::_::StructBuilder::asReader(&local_238.builder);
          local_68.schema.super_Schema.raw = SVar5.super_Schema.raw;
          field_05.parent.super_Schema.raw._7_1_ = local_308._7_1_;
          field_05.parent.super_Schema.raw._0_4_ = local_308.type;
          field_05.parent.super_Schema.raw._4_3_ = local_308._4_3_;
          field_05._12_4_ = local_308.field_1.intValue._4_4_;
          field_05.index = local_308.field_1.intValue._0_4_;
          field_05.proto._reader.segment._7_1_ = local_308.field_1._15_1_;
          field_05.proto._reader.segment._0_7_ = local_308.field_1._8_7_;
          field_05.proto._reader.capTable._7_1_ = local_308.builder.tag.content._7_1_;
          field_05.proto._reader.capTable._0_7_ = (undefined7)local_308.builder.tag.content;
          field_05.proto._reader.data._7_1_ = local_308.builder.segment._7_1_;
          field_05.proto._reader.data._0_7_ = local_308.builder.segment._0_7_;
          field_05.proto._reader.pointers._7_1_ = local_308.builder.capTable._7_1_;
          field_05.proto._reader.pointers._0_7_ = local_308.builder.capTable._0_7_;
          field_05.proto._reader._39_1_ = local_308.builder.location._7_1_;
          field_05.proto._reader.dataSize = local_308.builder.location._0_4_;
          field_05.proto._reader.pointerCount = local_308.builder.location._4_2_;
          field_05.proto._reader._38_1_ = local_308.builder.location._6_1_;
          field_05.proto._reader._47_1_ = uStack_2c9;
          field_05.proto._reader._40_7_ = uStack_2d0;
          bVar6 = DynamicStruct::Reader::has(&local_68,field_05,NON_NULL);
          if (bVar6) {
            local_198 = local_288;
            uStack_190 = uStack_280;
            local_1a8 = local_298;
            uStack_1a0 = uStack_290;
            local_1b8 = (WirePointer *)local_2b8._16_8_;
            uStack_1b0 = uStack_2a0;
            local_1c8 = (BuilderArena *)local_2b8._0_8_;
            pCStack_1c0 = (CapTableBuilder *)local_2b8._8_8_;
            field_06._8_8_ = local_2b8._8_8_;
            field_06.parent.super_Schema.raw = (Schema)(Schema)local_2b8._0_8_;
            field_06.proto._reader.segment = (SegmentReader *)local_2b8._16_8_;
            field_06.proto._reader.capTable = (CapTableReader *)uStack_2a0;
            field_06.proto._reader.data = (void *)local_298;
            field_06.proto._reader.pointers = (WirePointer *)uStack_290;
            field_06.proto._reader.dataSize = (undefined4)local_288;
            field_06.proto._reader.pointerCount = local_288._4_2_;
            field_06.proto._reader._38_2_ = local_288._6_2_;
            field_06.proto._reader._40_8_ = uStack_280;
            disown(&local_308,&local_238,field_06);
            field_07._8_8_ = pCStack_1c0;
            field_07.parent.super_Schema.raw = (Schema)(Schema)local_1c8;
            field_07.proto._reader.segment = (SegmentReader *)local_1b8;
            field_07.proto._reader.capTable = (CapTableReader *)uStack_1b0;
            field_07.proto._reader.data = (void *)local_1a8;
            field_07.proto._reader.pointers = (WirePointer *)uStack_1a0;
            field_07.proto._reader.dataSize = (undefined4)local_198;
            field_07.proto._reader.pointerCount = local_198._4_2_;
            field_07.proto._reader._38_2_ = local_198._6_2_;
            field_07.proto._reader._40_8_ = uStack_190;
            adopt(&local_98,field_07,&local_308);
            if (CONCAT17(local_308.builder.segment._7_1_,local_308.builder.segment._0_7_) != 0) {
              capnp::_::OrphanBuilder::euthanize(&local_308.builder);
            }
          }
          uVar8 = uVar8 + 1;
        } while ((uint)local_318 != uVar8);
      }
      Orphan<capnp::DynamicStruct>::get((Builder *)(local_358 + 8),&local_c0);
      local_358._0_4_ = STRUCT;
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)local_358,&local_c0.builder);
      if (local_c0.builder.segment == (SegmentBuilder *)0x0) {
        return __return_storage_ptr__;
      }
      capnp::_::OrphanBuilder::euthanize(&local_c0.builder);
      return __return_storage_ptr__;
    }
    if (*(short *)((long)field.proto._reader.data + 8) != 0) goto LAB_0038a471;
  }
  TVar11 = StructSchema::Field::getType(&field);
  uVar10 = 0xe;
  if (((undefined1  [16])TVar11 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
    uVar10 = TVar11._0_4_;
  }
  if ((ushort)uVar10 < 0x13) {
    if ((0x8fffU >> (uVar10 & 0x1f) & 1) == 0) {
      field_08.proto._reader.pointerCount = field.proto._reader.pointerCount;
      field_08.proto._reader._38_2_ = field.proto._reader._38_2_;
      field_08.proto._reader.dataSize = field.proto._reader.dataSize;
      field_08.index = field.index;
      field_08._12_4_ = field._12_4_;
      field_08.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
      field_08.proto._reader.segment = field.proto._reader.segment;
      field_08.proto._reader.capTable = field.proto._reader.capTable;
      field_08.proto._reader.data = field.proto._reader.data;
      field_08.proto._reader.pointers = field.proto._reader.pointers;
      field_08.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
      field_08.proto._reader._44_4_ = field.proto._reader._44_4_;
      get((Builder *)local_358,this,field_08);
      if (local_358._0_4_ == CAPABILITY) {
        local_278.raw._0_4_ = CAPABILITY;
        (**(code **)(*(long *)local_358._16_8_ + 0x20))();
        aStack_270.textValue.content.size_ = OStack_340.tag.content;
      }
      else {
        aStack_270._40_8_ = OStack_340.location;
        aStack_270._48_8_ = _uStack_320;
        aStack_270.listValue.builder.capTable = (CapTableBuilder *)OStack_340.segment;
        aStack_270.listValue.builder.ptr = (byte *)OStack_340.capTable;
        aStack_270.structValue.builder.segment = (SegmentBuilder *)local_358._16_8_;
        aStack_270.textValue.content.size_ = OStack_340.tag.content;
        local_278.raw = (RawBrandedSchema *)local_358._0_8_;
        aStack_270.anyPointerValue.builder.segment = (SegmentBuilder *)local_358._8_8_;
      }
      if (SVar4 < 0x40) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)*(uint *)((long)pvVar3 + 4);
      }
      local_2b8._16_8_ = (this->builder).pointers + uVar8;
      local_2b8._0_8_ = (this->builder).segment;
      local_2b8._8_8_ = (this->builder).capTable;
      capnp::_::PointerBuilder::disown((OrphanBuilder *)&local_308,(PointerBuilder *)local_2b8);
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)&local_278,(OrphanBuilder *)&local_308);
      if (CONCAT44(local_308.field_1.intValue._4_4_,local_308.field_1.intValue._0_4_) != 0) {
        capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_308);
      }
      uVar9 = aStack_270.textValue.content.ptr;
      if (((Type)local_278.raw == CAPABILITY) && (aStack_270._8_8_ != (SegmentBuilder *)0x0)) {
        aStack_270.textValue.content.ptr = (char *)0x0;
        (*(code *)(((aStack_270.anyPointerValue.builder.segment)->super_SegmentReader).arena)->
                  _vptr_Arena)
                  (aStack_270.intValue,
                   (char *)(uVar9 + (long)(((SegmentBuilder *)uVar9)->super_SegmentReader).arena[-2]
                                          ._vptr_Arena));
      }
      if ((local_358._0_4_ == CAPABILITY) &&
         ((SegmentBuilder *)local_358._16_8_ != (SegmentBuilder *)0x0)) {
        (*(code *)**(undefined8 **)local_358._8_8_)
                  (local_358._8_8_,
                   (char *)(local_358._16_8_ + *(long *)(*(long *)local_358._16_8_ + -0x10)));
      }
    }
    else {
      field_00.proto._reader.pointerCount = field.proto._reader.pointerCount;
      field_00.proto._reader._38_2_ = field.proto._reader._38_2_;
      field_00.proto._reader.dataSize = field.proto._reader.dataSize;
      field_00.index = field.index;
      field_00._12_4_ = field._12_4_;
      field_00.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
      field_00.proto._reader.segment = field.proto._reader.segment;
      field_00.proto._reader.capTable = field.proto._reader.capTable;
      field_00.proto._reader.data = field.proto._reader.data;
      field_00.proto._reader.pointers = field.proto._reader.pointers;
      field_00.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
      field_00.proto._reader._44_4_ = field.proto._reader._44_4_;
      get(&local_208,this,field_00);
      uVar8 = 0;
      switch(local_208.type) {
      case BOOL:
        uVar9 = ZEXT18(local_208.field_1.boolValue);
        uVar8 = 0;
        break;
      case INT:
      case UINT:
      case FLOAT:
      case STRUCT:
        uVar9 = CONCAT71(local_208.field_1.intValue._1_7_,local_208.field_1.boolValue);
        uVar8 = (ulong)(uint7)local_208.field_1.uintValue._1_7_;
        break;
      case LIST:
        uVar9 = CONCAT71(local_208.field_1.intValue._1_7_,local_208.field_1.boolValue);
        unaff_RBP = CONCAT62(local_208.field_1.dataValue.super_ArrayPtr<unsigned_char>.size_._2_6_,
                             local_208.field_1.enumValue.value);
        uVar8 = (ulong)(uint7)local_208.field_1.uintValue._1_7_;
        break;
      case ENUM:
        uVar9 = CONCAT71(local_208.field_1.intValue._1_7_,local_208.field_1.boolValue);
        uVar8 = (ulong)(uint7)local_208.field_1.uintValue._1_7_;
        unaff_RBP = (ulong)local_208.field_1.enumValue.value;
        break;
      case CAPABILITY:
        plVar2 = (long *)CONCAT62(local_208.field_1.dataValue.super_ArrayPtr<unsigned_char>.size_.
                                  _2_6_,local_208.field_1.enumValue.value);
        uVar8 = local_208.field_1.textValue.content.size_ >> 8;
        uVar9 = local_208.field_1.textValue.content.size_;
        if (plVar2 != (long *)0x0) {
          (*(code *)**(undefined8 **)
                      CONCAT71(local_208.field_1.intValue._1_7_,local_208.field_1.boolValue))
                    ((undefined8 *)
                     CONCAT71(local_208.field_1.intValue._1_7_,local_208.field_1.boolValue),
                     (long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
      field_01.proto._reader.pointerCount = field.proto._reader.pointerCount;
      field_01.proto._reader._38_2_ = field.proto._reader._38_2_;
      field_01.proto._reader.dataSize = field.proto._reader.dataSize;
      field_01.index = field.index;
      field_01._12_4_ = field._12_4_;
      field_01.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
      field_01.proto._reader.segment = field.proto._reader.segment;
      field_01.proto._reader.capTable = field.proto._reader.capTable;
      field_01.proto._reader.data = field.proto._reader.data;
      field_01.proto._reader.pointers = field.proto._reader.pointers;
      field_01.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
      field_01.proto._reader._44_4_ = field.proto._reader._44_4_;
      clear(this,field_01);
      __return_storage_ptr__->type = local_208.type;
      (__return_storage_ptr__->field_1).uintValue = uVar9 & 0xff | uVar8 << 8;
      *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = unaff_RBP;
      (__return_storage_ptr__->builder).tag.content = 0;
      (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
      (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
      (__return_storage_ptr__->builder).location = (word *)0x0;
    }
    return __return_storage_ptr__;
  }
LAB_0038a471:
  kj::_::unreachable();
}

Assistant:

Orphan<DynamicValue> DynamicStruct::Builder::disown(StructSchema::Field field) {
  // We end up calling get(field) below, so we don't need to validate `field` here.

  auto proto = field.getProto();
  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();

      switch (field.getType().which()) {
        case schema::Type::VOID:
        case schema::Type::BOOL:
        case schema::Type::INT8:
        case schema::Type::INT16:
        case schema::Type::INT32:
        case schema::Type::INT64:
        case schema::Type::UINT8:
        case schema::Type::UINT16:
        case schema::Type::UINT32:
        case schema::Type::UINT64:
        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
        case schema::Type::ENUM: {
          auto result = Orphan<DynamicValue>(get(field), _::OrphanBuilder());
          clear(field);
          return kj::mv(result);
        }

        case schema::Type::TEXT:
        case schema::Type::DATA:
        case schema::Type::LIST:
        case schema::Type::STRUCT:
        case schema::Type::ANY_POINTER:
        case schema::Type::INTERFACE: {
          auto value = get(field);
          return Orphan<DynamicValue>(
              value, builder.getPointerField(assumePointerOffset(slot.getOffset())).disown());
        }
      }
      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP: {
      // We have to allocate new space for the group, unfortunately.
      auto src = get(field).as<DynamicStruct>();

      Orphan<DynamicStruct> result =
          Orphanage::getForMessageContaining(*this).newOrphan(src.getSchema());
      auto dst = result.get();

      KJ_IF_SOME(unionField, src.which()) {
        dst.adopt(unionField, src.disown(unionField));
      }

      // We need to explicitly reset the union to its default field.
      KJ_IF_SOME(unionField, src.schema.getFieldByDiscriminant(0)) {
        src.clear(unionField);
      }

      for (auto field: src.schema.getNonUnionFields()) {
        if (src.has(field)) {
          dst.adopt(field, src.disown(field));
        }
      }

      return kj::mv(result);
    }
  }

  KJ_UNREACHABLE;
}